

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

BinaryenIndex BinaryenStructTypeGetNumFields(BinaryenHeapType heapType)

{
  bool bVar1;
  Struct *this;
  size_type sVar2;
  HeapType local_18;
  HeapType ht;
  BinaryenHeapType heapType_local;
  
  ht.id = heapType;
  wasm::HeapType::HeapType(&local_18,heapType);
  bVar1 = wasm::HeapType::isStruct(&local_18);
  if (!bVar1) {
    __assert_fail("ht.isStruct()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                  ,0x155,"BinaryenIndex BinaryenStructTypeGetNumFields(BinaryenHeapType)");
  }
  this = wasm::HeapType::getStruct(&local_18);
  sVar2 = std::vector<wasm::Field,_std::allocator<wasm::Field>_>::size(&this->fields);
  return (BinaryenIndex)sVar2;
}

Assistant:

BinaryenIndex BinaryenStructTypeGetNumFields(BinaryenHeapType heapType) {
  auto ht = HeapType(heapType);
  assert(ht.isStruct());
  return ht.getStruct().fields.size();
}